

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoarimatest3.c
# Opt level: O2

int main(void)

{
  int iVar1;
  double *xpred;
  double *amse;
  FILE *__stream;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  auto_arima_object obj;
  long lVar5;
  int N;
  long lVar6;
  double dVar7;
  double local_70e8;
  double temp [1200];
  double temp1 [1200];
  double temp2 [1200];
  int local_60 [2];
  int order [3];
  int seasonal [3];
  
  local_60[0] = 5;
  local_60[1] = 2;
  order[0] = 5;
  order[1] = 2;
  order[2] = 1;
  xpred = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/e1m.dat","r");
  if (__stream != (FILE *)0x0) {
    N = -5;
    pdVar2 = temp1 + 0x4af;
    pdVar3 = temp + 0x4af;
    pdVar4 = &local_70e8;
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      __isoc99_fscanf(__stream,"%lf %lf %lf \n",pdVar4,pdVar3,pdVar2);
      N = N + 1;
      pdVar2 = pdVar2 + 1;
      pdVar3 = pdVar3 + 1;
      pdVar4 = pdVar4 + 1;
    }
    lVar6 = (long)N;
    pdVar2 = (double *)malloc(lVar6 * 8);
    pdVar3 = (double *)malloc(lVar6 << 4);
    pdVar4 = (double *)malloc(0x50);
    for (lVar5 = 0; lVar5 < lVar6; lVar5 = lVar5 + 1) {
      pdVar2[lVar5] = temp[lVar5 + -1];
      pdVar3[lVar5] = temp[lVar5 + 0x4af];
      pdVar3[lVar6 + lVar5] = temp1[lVar5 + 0x4af];
    }
    for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
      pdVar4[lVar5] = temp[lVar6 + lVar5 + 0x4af];
      pdVar4[lVar5 + 5] = temp1[lVar6 + lVar5 + 0x4af];
    }
    obj = auto_arima_init(local_60,order + 1,0,2,N);
    auto_arima_setApproximation(obj,1);
    auto_arima_setStepwise(obj,1);
    auto_arima_setVerbose(obj,1);
    auto_arima_exec(obj,pdVar2,pdVar3);
    auto_arima_summary(obj);
    auto_arima_predict(obj,pdVar2,pdVar3,5,pdVar4,xpred,amse);
    putchar(10);
    printf("Predicted Values : ");
    for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
      printf("%g ",xpred[lVar5]);
    }
    putchar(10);
    printf("Standard Errors  : ");
    for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
      dVar7 = amse[lVar5];
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      printf("%g ",dVar7);
    }
    putchar(10);
    auto_arima_free(obj);
    free(pdVar2);
    free(xpred);
    free(amse);
    free(pdVar3);
    free(pdVar4);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main(void) {
    int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *xpred, *amse,*xreg,*newxreg;
	auto_arima_object obj;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 5;
	d = 2;
	q = 5;
	P = 2;
	D = 1;
	Q = 2;
	
	int order[3] = {p,d,q};
	int seasonal[3] = {P,D,Q};

    s = 0;
    r = 2;
	L = 5;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/e1m.dat", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf %lf %lf \n", &temp[i],&temp1[i],&temp2[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);


	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        xreg[i] = temp1[i];
		xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        newxreg[i] = temp1[N + i];
        newxreg[i+L] = temp2[N + i];
    }

	obj = auto_arima_init(order,seasonal,s,r,N);

	auto_arima_setApproximation(obj,1);
	auto_arima_setStepwise(obj,1);
	auto_arima_setVerbose(obj,1);

	auto_arima_exec(obj,inp,xreg);

	auto_arima_summary(obj);

	auto_arima_predict(obj, inp, xreg, L,newxreg, xpred, amse);

	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");

	auto_arima_free(obj);

	
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);

    return 0;
}